

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O1

void __thiscall
chrono::copter::Copter<6>::Copter
          (Copter<6> *this,ChSystem *sys,ChVector<double> *cpos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos,
          bool *clockwise,bool are_prop_pos_rel,bool z_up)

{
  shared_ptr<chrono::ChBody> *psVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *peVar6;
  pointer pCVar7;
  element_type *peVar8;
  double dVar9;
  element_type *peVar10;
  double *pdVar11;
  ChBody *pCVar12;
  code *size;
  value_type *__x;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  undefined3 in_register_00000089;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  shared_ptr<chrono::ChBody> prop;
  ChQuaternion<double> motor_rot;
  shared_ptr<chrono::ChForce> backtorque;
  shared_ptr<chrono::ChForce> thrust;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> propmot;
  shared_ptr<chrono::ChFunction_Const> speed;
  value_type local_310;
  undefined1 local_2f9;
  ChQuaternion<double> local_2f8;
  undefined4 local_2cc;
  value_type local_2c8;
  value_type local_2b8;
  value_type local_2a8;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *local_298;
  undefined **local_290;
  ChVector<double> *local_288;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_280;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_278;
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  *local_270;
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  *local_268;
  vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  *local_260;
  ChVector<double> *local_258;
  bool *local_250;
  value_type local_248;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  element_type *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  ChLinkMotorRotationSpeed *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  shared_ptr<chrono::ChFunction> local_208;
  element_type *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  ChBody *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  element_type *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  ChBody *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  ChBody *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  value_type local_1a8;
  _func_int **local_198;
  _func_int **local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  ulong local_158;
  undefined8 uStack_150;
  undefined **local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_118;
  double dStack_110;
  double dStack_108;
  ChMatrix33<double> local_100;
  undefined **local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  double dStack_88;
  double dStack_80;
  ChMatrix33<double> local_78;
  
  local_2cc = CONCAT31(in_register_00000089,are_prop_pos_rel);
  this->_vptr_Copter = (_func_int **)&PTR_GetChassisMeshFilename_abi_cxx11__0017f8a8;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->chassis_mesh_path)._M_dataplus._M_p = (pointer)&(this->chassis_mesh_path).field_2;
  (this->chassis_mesh_path)._M_string_length = 0;
  (this->chassis_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->propeller_mesh_path)._M_dataplus._M_p = (pointer)&(this->propeller_mesh_path).field_2;
  (this->propeller_mesh_path)._M_string_length = 0;
  (this->propeller_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->rho = 1.225;
  this->rho0 = 1.225;
  this->pressure = 101325.0;
  this->pressure0 = 101325.0;
  this->Temp0 = 298.0;
  this->Temp = 298.0;
  local_258 = &this->up;
  if (z_up) {
    pdVar11 = (double *)&VECT_Z;
  }
  else {
    pdVar11 = (double *)&VECT_Y;
  }
  this->Altitude0 = 0.0;
  this->h0 = 0.0;
  (this->up).m_data[0] = 0.0;
  (this->up).m_data[1] = 0.0;
  (this->up).m_data[2] = 0.0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Cd = 0.0;
  (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->Surf = 0.0;
  size = (code *)sys;
  if ((ChVector<double> *)pdVar11 != local_258) {
    (this->up).m_data[0] = *pdVar11;
    size = std::__cxx11::string::_M_create;
    if (z_up) {
      size = __cxa_atexit;
    }
    (this->up).m_data[1] = *(double *)size;
    pdVar11 = (double *)std::__cxx11::string::~string;
    if (z_up) {
      pdVar11 = (double *)&__libc_single_threaded;
    }
    (this->up).m_data[2] = *pdVar11;
  }
  local_260 = &this->props;
  local_278 = &this->thrusts;
  local_280 = &this->backtorques;
  local_268 = &this->motors;
  local_270 = &this->speeds;
  local_298 = ppos;
  local_250 = clockwise;
  pCVar12 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)size);
  chrono::ChBody::ChBody(pCVar12,0);
  local_2f8.m_data[0] = (double)pCVar12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8.m_data + 1),pCVar12);
  dVar2 = local_2f8.m_data[1];
  dVar9 = local_2f8.m_data[0];
  local_2f8.m_data[0] = 0.0;
  local_2f8.m_data[1] = 0.0;
  p_Var13 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar9;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar2;
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  }
  psVar1 = &this->chassis;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1]);
  }
  peVar6 = (psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar6 + 0x80 != (element_type *)cpos) {
    *(double *)(peVar6 + 0x80) = cpos->m_data[0];
    *(double *)(peVar6 + 0x88) = cpos->m_data[1];
    *(double *)(peVar6 + 0x90) = cpos->m_data[2];
  }
  chrono::ChVariablesBodyOwnMass::SetBodyMass(10.0);
  local_2f8.m_data[0] = (double)&DAT_3ff0000000000000;
  local_2f8.m_data[1] = (double)&DAT_3ff0000000000000;
  local_2f8.m_data[2] = 1.0;
  chrono::ChBody::SetInertiaXX
            ((psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0
                  ));
  local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  __x = &local_1a8;
  (**(code **)(*(long *)sys + 0x128))(sys);
  local_288 = cpos;
  if (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(peVar6 + 0x80);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->up).m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(double *)(peVar6 + 0x88) * (this->up).m_data[1];
  auVar4 = vfmadd231sd_fma(auVar19,auVar16,auVar4);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(peVar6 + 0x90);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->up).m_data[2];
  auVar4 = vfmadd132sd_fma(auVar17,auVar4,auVar5);
  this->h0 = auVar4._0_8_;
  local_290 = &PTR__ChFrame_0017db90;
  local_190 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017eeb8;
  local_198 = (_func_int **)chrono::ChClassFactory::GetGlobalClassFactory;
  local_158 = 0x8000000000000000;
  uStack_150 = 0x8000000000000000;
  lVar15 = 0;
  lVar14 = 0;
  do {
    pCVar12 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)__x);
    chrono::ChBody::ChBody(pCVar12,0);
    local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
              (&local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pCVar12);
    std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
    ::push_back(local_260,&local_310);
    pCVar7 = (local_298->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((char)local_2cc == '\0') {
      if ((ChBody *)((long)pCVar7->m_data + lVar15) !=
          local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) {
        *(undefined8 *)
         (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) =
             *(undefined8 *)((long)pCVar7->m_data + lVar15);
        *(undefined8 *)
         (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x88) =
             *(undefined8 *)((long)pCVar7->m_data + lVar15 + 8);
        dVar9 = *(double *)((long)pCVar7->m_data + lVar15 + 0x10);
        goto LAB_0016833c;
      }
    }
    else {
      dVar9 = local_288->m_data[2] + *(double *)((long)pCVar7->m_data + lVar15 + 0x10);
      dVar2 = local_288->m_data[1];
      dVar3 = *(double *)((long)pCVar7->m_data + lVar15 + 8);
      *(double *)
       (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) =
           local_288->m_data[0] + *(double *)((long)pCVar7->m_data + lVar15);
      *(double *)
       (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x88) =
           dVar2 + dVar3;
LAB_0016833c:
      *(double *)
       (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x90) =
           dVar9;
    }
    chrono::ChVariablesBodyOwnMass::SetBodyMass(1.0);
    local_2f8.m_data[0] = 0.2;
    local_2f8.m_data[1] = 0.2;
    local_2f8.m_data[2] = 0.2;
    chrono::ChBody::SetInertiaXX
              (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    chrono::ChBody::SetBodyFixed
              (SUB81(local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,0));
    local_1b8 = local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1b0 = local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
    if (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    (**(code **)(*(long *)sys + 0x128))(sys,&local_1b8);
    if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
    }
    local_2a8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (ChLinkMotorRotationSpeed *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLinkMotorRotationSpeed,std::allocator<chrono::ChLinkMotorRotationSpeed>>
              (&local_2a8.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChLinkMotorRotationSpeed **)&local_2a8,
               (allocator<chrono::ChLinkMotorRotationSpeed> *)&local_2f8);
    peVar10 = local_2a8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_2f8.m_data[0] = (double)Q_ROTATE_Y_TO_Z;
    local_2f8.m_data[1] = (double)_memset;
    local_2f8.m_data[2] = _ConstraintsBiLoad_Qc;
    local_2f8.m_data[3] = _operator<<;
    if (z_up) {
      local_2f8.m_data[0] = (double)QUNIT;
      local_2f8.m_data[1] = (double)_ChLinkMotorRotationSpeed;
      local_2f8.m_data[2] = _ChBody;
      local_2f8.m_data[3] = _ComputeMassProperties;
    }
    if (local_250[lVar14] == true) {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = Q_FLIP_AROUND_X;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = _Initialize;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_2f8.m_data[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_2f8.m_data[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_2f8.m_data[1] * _Initialize;
      auVar4 = vfmsub231sd_fma(auVar24,auVar18,auVar21);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = _SetMforce;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_2f8.m_data[2];
      auVar4 = vfnmadd231sd_fma(auVar4,auVar25,auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = _Initialize;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_2f8.m_data[3];
      auVar16 = vfnmadd231sd_fma(auVar4,auVar27,auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_2f8.m_data[0] * _Initialize;
      auVar4 = vfmadd231sd_fma(auVar29,auVar18,auVar23);
      auVar4 = vfnmadd231sd_fma(auVar4,auVar27,auVar26);
      auVar4 = vfmadd231sd_fma(auVar4,auVar25,auVar28);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_2f8.m_data[0] * _SetMforce;
      auVar5 = vfmadd231sd_fma(auVar30,auVar18,auVar26);
      auVar5 = vfmadd231sd_fma(auVar5,auVar27,auVar23);
      auVar17 = vfnmadd231sd_fma(auVar5,auVar20,auVar28);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_2f8.m_data[0] * _Initialize;
      auVar5 = vfmadd231sd_fma(auVar22,auVar18,auVar28);
      auVar5 = vfnmadd231sd_fma(auVar5,auVar25,auVar23);
      auVar5 = vfmadd231sd_fma(auVar5,auVar20,auVar26);
      local_2f8.m_data[0] = auVar16._0_8_;
      local_2f8.m_data[1] = auVar4._0_8_;
      local_2f8.m_data[2] = auVar17._0_8_;
      local_2f8.m_data[3] = auVar5._0_8_;
    }
    pCVar12 = local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78
    ;
    if (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (ChBody *)0x0) {
      pCVar12 = (ChBody *)0x0;
    }
    if ((char)local_2cc == '\0') {
      local_1e0 = local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_1f8 = peVar6 + 0x78;
      if (peVar6 == (element_type *)0x0) {
        local_1f8 = (element_type *)0x0;
      }
      local_1f0 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1f0->_M_use_count = local_1f0->_M_use_count + 1;
        }
      }
      pCVar7 = (local_298->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_140 = local_290;
      local_138 = *(undefined8 *)((long)pCVar7->m_data + lVar15);
      local_130 = *(undefined8 *)((long)pCVar7->m_data + lVar15 + 8);
      local_128 = *(undefined8 *)((long)pCVar7->m_data + lVar15 + 0x10);
      local_120 = (undefined1 *)local_2f8.m_data[0];
      p_Stack_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1];
      dStack_110 = local_2f8.m_data[2];
      dStack_108 = local_2f8.m_data[3];
      local_1e8 = pCVar12;
      ChMatrix33<double>::ChMatrix33(&local_100,&local_2f8);
      (**(code **)(*(long *)peVar10 + 0x240))(peVar10,&local_1e8,&local_1f8,&local_140);
      p_Var13 = local_1e0;
      if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
        p_Var13 = local_1e0;
      }
    }
    else {
      local_1c0 = local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_1d8 = peVar6 + 0x78;
      if (peVar6 == (element_type *)0x0) {
        local_1d8 = (element_type *)0x0;
      }
      local_1d0 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
        }
      }
      pCVar7 = (local_298->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b0 = local_288->m_data[0] + *(double *)((long)pCVar7->m_data + lVar15);
      local_a8 = local_288->m_data[1] + *(double *)((long)pCVar7->m_data + lVar15 + 8);
      local_a0 = local_288->m_data[2] + *(double *)((long)pCVar7->m_data + lVar15 + 0x10);
      local_b8 = local_290;
      local_98 = (undefined1 *)local_2f8.m_data[0];
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1];
      dStack_88 = local_2f8.m_data[2];
      dStack_80 = local_2f8.m_data[3];
      local_1c8 = pCVar12;
      ChMatrix33<double>::ChMatrix33(&local_78,&local_2f8);
      (**(code **)(*(long *)peVar10 + 0x240))(peVar10,&local_1c8,&local_1d8,&local_b8);
      p_Var13 = local_1c0;
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
        p_Var13 = local_1c0;
      }
    }
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_use_count = 1;
    (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_M_weak_count = 1;
    (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi)->_vptr__Sp_counted_base = local_190;
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = local_198;
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_use_count = 0;
    local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 2;
    }
    local_208.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_208.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    ChLinkMotorRotationSpeed::SetSpeedFunction
              (local_2a8.
               super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_208);
    if (local_208.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_218 = local_2a8.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_210 = local_2a8.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_2a8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2a8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_2a8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2a8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_2a8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (**(code **)(*(long *)sys + 0x138))(sys,&local_218);
    if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
    }
    std::
    vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
    ::push_back(local_268,&local_2a8);
    std::
    vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
    ::push_back(local_270,&local_248);
    this->u_p[lVar14] = 0.0;
    local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
              (&local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChForce **)&local_2b8,(allocator<chrono::ChForce> *)&local_2c8);
    *(element_type **)
     (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x38) =
         local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_228 = local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_220 = local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    chrono::ChBody::AddForce
              (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_228);
    if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
    }
    *(undefined4 *)
     (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x40) = 0;
    chrono::ChForce::SetMforce(0.0);
    local_170 = (this->up).m_data[0];
    local_168 = (this->up).m_data[1];
    local_160 = (this->up).m_data[2];
    chrono::ChForce::SetRelDir
              (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_170);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_278,&local_2b8);
    local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
              (&local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChForce **)&local_2c8,(allocator<chrono::ChForce> *)&local_2f9);
    *(element_type **)
     (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x38) =
         local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_238 = local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_230 = local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    chrono::ChBody::AddForce
              (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_238);
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
    }
    *(undefined4 *)
     (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x40) = 1;
    chrono::ChForce::SetMforce(0.0);
    local_188 = local_258->m_data[0];
    if (local_250[lVar14] == true) {
      local_180 = (this->up).m_data[1];
      local_178 = (this->up).m_data[2];
    }
    else {
      local_188 = (double)((ulong)local_188 ^ local_158);
      local_180 = (double)((ulong)(this->up).m_data[1] ^ local_158);
      local_178 = (double)((ulong)(this->up).m_data[2] ^ local_158);
    }
    chrono::ChForce::SetRelDir
              (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_188);
    __x = &local_2c8;
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_280,__x);
    if (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2b8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_248.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_2a8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.
                 super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_310.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar14 = lVar14 + 1;
    lVar15 = lVar15 + 0x18;
    if (lVar15 == 0x90) {
      local_2f8.m_data[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8.m_data + 1),
                 (ChForce **)&local_2f8,(allocator<chrono::ChForce> *)&local_310);
      dVar2 = local_2f8.m_data[1];
      dVar9 = local_2f8.m_data[0];
      local_2f8.m_data[0] = 0.0;
      local_2f8.m_data[1] = 0.0;
      p_Var13 = (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)dVar9;
      (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar2;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.m_data[1]);
      }
      peVar8 = (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      *(element_type **)(peVar8 + 0x38) =
           (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined4 *)(peVar8 + 0x40) = 0;
      chrono::ChForce::SetMforce(0.0);
      return;
    }
  } while( true );
}

Assistant:

Copter<nop>::Copter(ChSystem& sys,
                    const ChVector<>& cpos,
                    std::vector<ChVector<>> ppos,
                    const bool clockwise[],
                    bool are_prop_pos_rel,
                    bool z_up) {
    // TODO: ChBodyAuxRef here might be more convenient
    up = (z_up) ? VECT_Z : VECT_Y;
    chassis = chrono_types::make_shared<ChBody>();
    chassis->SetPos(cpos);
    // placeholder Data.
    chassis->SetMass(10);
    chassis->SetInertiaXX(ChVector<>(1, 1, 1));
    chassis->SetBodyFixed(false);
    sys.AddBody(chassis);
    h0 = chassis->GetPos() ^ up;
    // 26.4 inch propellers
    for (int p = 0; p < nop; p++) {
        auto prop = chrono_types::make_shared<ChBody>();
        props.push_back(prop);
        if (are_prop_pos_rel) {
            prop->SetPos(cpos + ppos[p]);
        } else {
            prop->SetPos(ppos[p]);
        }
        // Data from little hexy, page 132.
        prop->SetMass(1);
        prop->SetInertiaXX(ChVector<>(0.2, 0.2, 0.2));
        prop->SetBodyFixed(false);
        sys.AddBody(prop);

        auto propmot = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
        ChQuaternion<> motor_rot = Q_ROTATE_Y_TO_Z;
        if (z_up) {
            motor_rot = QUNIT;
        };
        if (clockwise[p]) {
            motor_rot = Q_FLIP_AROUND_X * motor_rot;
        };
        
        if (are_prop_pos_rel) {
            propmot->Initialize(prop, chassis, ChFrame<>(cpos + ppos[p], motor_rot)); 
        } else {
            propmot->Initialize(prop, chassis, ChFrame<>(ppos[p], motor_rot));
        }
        auto speed = chrono_types::make_shared<ChFunction_Const>(0);
        propmot->SetSpeedFunction(speed);
        sys.AddLink(propmot);

        motors.push_back(propmot);
        speeds.push_back(speed);

        u_p[p] = 0;
        auto thrust = chrono_types::make_shared<ChForce>();
        thrust->SetBody(prop.get());
        prop->AddForce(thrust);
        thrust->SetMode(ChForce::FORCE);
        thrust->SetMforce(0);
        thrust->SetRelDir(up);
        thrusts.push_back(thrust);

        auto backtorque = std::make_shared<ChForce>();
        backtorque->SetBody(prop.get());
        prop->AddForce(backtorque);
        backtorque->SetMode(ChForce::TORQUE);
        backtorque->SetMforce(0);
        // Resistance Torque direction opposed to omega
        ChVector<> tdir = (clockwise[p]) ? up : -up;
        backtorque->SetRelDir(tdir);
        backtorques.push_back(backtorque);
    }

    // linear drag on copter body
    lin_drag = std::make_shared<ChForce>();
    lin_drag->SetBody(chassis.get());
    lin_drag->SetMode(ChForce::FORCE);
    lin_drag->SetMforce(0);
}